

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerFilterCase::test
          (SamplerFilterCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  GLenum GVar1;
  GLuint GVar2;
  int iVar3;
  deUint32 dVar4;
  bool bVar5;
  deBool dVar6;
  TestLog *pTVar7;
  size_type sVar8;
  reference pvVar9;
  Enum<int,_2UL> EVar10;
  int local_474;
  bool local_461;
  GetNameFunc local_450;
  int local_448;
  string local_440;
  allocator<char> local_419;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  GLenum local_398;
  int local_394;
  deUint32 err_3;
  int ndx_2;
  int local_388;
  GetNameFunc local_380;
  int local_378;
  string local_370;
  allocator<char> local_349;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  GLenum local_2c8;
  int local_2c4;
  deUint32 err_2;
  int ndx_1;
  int local_2b8;
  GetNameFunc local_2b0;
  int local_2a8;
  string local_2a0;
  allocator<char> local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  GLenum local_1f8;
  value_type local_1f4;
  deUint32 err_1;
  GLuint value_1;
  int local_1e8;
  GetNameFunc local_1e0;
  int local_1d8;
  string local_1d0;
  allocator<char> local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  GLenum local_124;
  value_type local_120;
  deUint32 err;
  GLint value;
  int ndx;
  value_type_conflict4 local_110 [4];
  undefined1 local_100 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  ScopedLogSection local_98;
  ScopedLogSection section_1;
  string local_88;
  allocator<char> local_51;
  string local_50;
  ScopedLogSection local_30;
  ScopedLogSection section;
  GLenum initial;
  bool isPureCase;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  SamplerFilterCase *this_local;
  
  bVar5 = isPureIntTester((this->super_SamplerTest).m_tester);
  local_461 = true;
  if (!bVar5) {
    local_461 = isPureUintTester((this->super_SamplerTest).m_tester);
  }
  section.m_log._7_1_ = local_461;
  if ((this->super_SamplerTest).m_pname == 0x2800) {
    local_474 = 0x2601;
  }
  else {
    local_474 = 0;
    if ((this->super_SamplerTest).m_pname == 0x2801) {
      local_474 = 0x2702;
    }
  }
  section.m_log._0_4_ = local_474;
  if (local_461 == false) {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Initial",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Initial",(allocator<char> *)((long)&section_1.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_30,pTVar7,&local_50,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
               (int)section.m_log,(this->super_SamplerTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&local_30);
  }
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Set",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Set",
             (allocator<char> *)
             ((long)&values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_98,pTVar7,&local_b8,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
  local_110[3] = 0x2600;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,local_110 + 3);
  local_110[2] = 0x2601;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,local_110 + 2);
  if ((this->super_SamplerTest).m_pname == 0x2801) {
    local_110[1] = 0x2700;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,local_110 + 1);
    local_110[0] = 0x2702;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,local_110);
    ndx = 0x2701;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
               (value_type_conflict4 *)&ndx);
    value = 0x2703;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
               (value_type_conflict4 *)&value);
  }
  if ((section.m_log._7_1_ & 1) == 0) {
    for (local_2c4 = 0; iVar3 = local_2c4,
        sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100),
        iVar3 < (int)sVar8; local_2c4 = local_2c4 + 1) {
      GVar1 = (this->super_SamplerTest).m_pname;
      GVar2 = (this->super_SamplerTest).m_target;
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
                          (long)local_2c4);
      glu::CallLogWrapper::glSamplerParameteri(gl,GVar2,GVar1,*pvVar9);
      do {
        local_2c8 = glu::CallLogWrapper::glGetError(gl);
        if (local_2c8 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_348,"Got Error ",&local_349);
          EVar10 = glu::getErrorStr(local_2c8);
          _err_3 = EVar10.m_getName;
          local_388 = EVar10.m_value;
          local_380 = _err_3;
          local_378 = local_388;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_370,&local_380);
          std::operator+(&local_328,&local_348,&local_370);
          std::operator+(&local_308,&local_328,": ");
          std::operator+(&local_2e8,&local_308,"glSamplerParameteri");
          tcu::ResultCollector::fail(result,&local_2e8);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::~string((string *)&local_308);
          std::__cxx11::string::~string((string *)&local_328);
          std::__cxx11::string::~string((string *)&local_370);
          std::__cxx11::string::~string((string *)&local_348);
          std::allocator<char>::~allocator(&local_349);
        }
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      GVar1 = (this->super_SamplerTest).m_pname;
      GVar2 = (this->super_SamplerTest).m_target;
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
                          (long)local_2c4);
      StateQueryUtil::verifyStateSamplerParamInteger
                (result,gl,GVar2,GVar1,*pvVar9,(this->super_SamplerTest).m_type);
    }
    for (local_394 = 0; iVar3 = local_394,
        sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100),
        iVar3 < (int)sVar8; local_394 = local_394 + 1) {
      GVar1 = (this->super_SamplerTest).m_pname;
      GVar2 = (this->super_SamplerTest).m_target;
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
                          (long)local_394);
      glu::CallLogWrapper::glSamplerParameterf(gl,GVar2,GVar1,(float)*pvVar9);
      do {
        local_398 = glu::CallLogWrapper::glGetError(gl);
        if (local_398 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_418,"Got Error ",&local_419);
          EVar10 = glu::getErrorStr(local_398);
          local_450 = EVar10.m_getName;
          local_448 = EVar10.m_value;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_440,&local_450);
          std::operator+(&local_3f8,&local_418,&local_440);
          std::operator+(&local_3d8,&local_3f8,": ");
          std::operator+(&local_3b8,&local_3d8,"glSamplerParameterf");
          tcu::ResultCollector::fail(result,&local_3b8);
          std::__cxx11::string::~string((string *)&local_3b8);
          std::__cxx11::string::~string((string *)&local_3d8);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_440);
          std::__cxx11::string::~string((string *)&local_418);
          std::allocator<char>::~allocator(&local_419);
        }
        dVar6 = ::deGetFalse();
      } while (dVar6 != 0);
      GVar1 = (this->super_SamplerTest).m_pname;
      GVar2 = (this->super_SamplerTest).m_target;
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
                          (long)local_394);
      StateQueryUtil::verifyStateSamplerParamInteger
                (result,gl,GVar2,GVar1,*pvVar9,(this->super_SamplerTest).m_type);
    }
  }
  else {
    for (err = 0; dVar4 = err,
        sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100),
        (int)dVar4 < (int)sVar8; err = err + 1) {
      bVar5 = isPureIntTester((this->super_SamplerTest).m_tester);
      if (bVar5) {
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
                            (long)(int)err);
        local_120 = *pvVar9;
        glu::CallLogWrapper::glSamplerParameterIiv
                  (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                   (GLint *)&local_120);
        do {
          local_124 = glu::CallLogWrapper::glGetError(gl);
          if (local_124 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a8,"Got Error ",&local_1a9);
            EVar10 = glu::getErrorStr(local_124);
            _err_1 = EVar10.m_getName;
            local_1e8 = EVar10.m_value;
            local_1e0 = _err_1;
            local_1d8 = local_1e8;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1d0,&local_1e0);
            std::operator+(&local_188,&local_1a8,&local_1d0);
            std::operator+(&local_168,&local_188,": ");
            std::operator+(&local_148,&local_168,"glSamplerParameterIiv");
            tcu::ResultCollector::fail(result,&local_148);
            std::__cxx11::string::~string((string *)&local_148);
            std::__cxx11::string::~string((string *)&local_168);
            std::__cxx11::string::~string((string *)&local_188);
            std::__cxx11::string::~string((string *)&local_1d0);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::allocator<char>::~allocator(&local_1a9);
          }
          dVar6 = ::deGetFalse();
        } while (dVar6 != 0);
      }
      else {
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
                            (long)(int)err);
        local_1f4 = *pvVar9;
        glu::CallLogWrapper::glSamplerParameterIuiv
                  (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                   &local_1f4);
        do {
          local_1f8 = glu::CallLogWrapper::glGetError(gl);
          if (local_1f8 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_278,"Got Error ",&local_279);
            EVar10 = glu::getErrorStr(local_1f8);
            _err_2 = EVar10.m_getName;
            local_2b8 = EVar10.m_value;
            local_2b0 = _err_2;
            local_2a8 = local_2b8;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2a0,&local_2b0);
            std::operator+(&local_258,&local_278,&local_2a0);
            std::operator+(&local_238,&local_258,": ");
            std::operator+(&local_218,&local_238,"glSamplerParameterIuiv");
            tcu::ResultCollector::fail(result,&local_218);
            std::__cxx11::string::~string((string *)&local_218);
            std::__cxx11::string::~string((string *)&local_238);
            std::__cxx11::string::~string((string *)&local_258);
            std::__cxx11::string::~string((string *)&local_2a0);
            std::__cxx11::string::~string((string *)&local_278);
            std::allocator<char>::~allocator(&local_279);
          }
          dVar6 = ::deGetFalse();
        } while (dVar6 != 0);
      }
      GVar1 = (this->super_SamplerTest).m_pname;
      GVar2 = (this->super_SamplerTest).m_target;
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
                          (long)(int)err);
      StateQueryUtil::verifyStateSamplerParamInteger
                (result,gl,GVar2,GVar1,*pvVar9,(this->super_SamplerTest).m_type);
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
  tcu::ScopedLogSection::~ScopedLogSection(&local_98);
  return;
}

Assistant:

void SamplerFilterCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool			isPureCase	= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	const glw::GLenum	initial		= (m_pname == GL_TEXTURE_MAG_FILTER) ? (GL_LINEAR)
									: (m_pname == GL_TEXTURE_MIN_FILTER) ? (GL_NEAREST_MIPMAP_LINEAR)
									: (0);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, initial, m_type);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Set", "Set");
		std::vector<GLenum>			values;

		values.push_back(GL_NEAREST);
		values.push_back(GL_LINEAR);
		if (m_pname == GL_TEXTURE_MIN_FILTER)
		{
			values.push_back(GL_NEAREST_MIPMAP_NEAREST);
			values.push_back(GL_NEAREST_MIPMAP_LINEAR);
			values.push_back(GL_LINEAR_MIPMAP_NEAREST);
			values.push_back(GL_LINEAR_MIPMAP_LINEAR);
		}

		if (isPureCase)
		{
			for (int ndx = 0; ndx < (int)values.size(); ++ndx)
			{
				if (isPureIntTester(m_tester))
				{
					const glw::GLint value = (glw::GLint)values[ndx];
					gl.glSamplerParameterIiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIiv");
				}
				else
				{
					DE_ASSERT(isPureUintTester(m_tester));

					const glw::GLuint value = values[ndx];
					gl.glSamplerParameterIuiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIuiv");
				}

				verifyStateSamplerParamInteger(result, gl, m_target, m_pname, values[ndx], m_type);
			}
		}
		else
		{
			for (int ndx = 0; ndx < (int)values.size(); ++ndx)
			{
				gl.glSamplerParameteri(m_target, m_pname, values[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameteri");

				verifyStateSamplerParamInteger(result, gl, m_target, m_pname, values[ndx], m_type);
			}

			//check unit conversions with float

			for (int ndx = 0; ndx < (int)values.size(); ++ndx)
			{
				gl.glSamplerParameterf(m_target, m_pname, (GLfloat)values[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterf");

				verifyStateSamplerParamInteger(result, gl, m_target, m_pname, values[ndx], m_type);
			}
		}
	}
}